

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

unique_color __thiscall
crnlib::dxt1_endpoint_optimizer::lerp_color
          (dxt1_endpoint_optimizer *this,color_quad_u8 *a,color_quad_u8 *b,float f,int rounding)

{
  int iVar1;
  undefined4 in_register_0000000c;
  byte *pbVar2;
  undefined1 uVar3;
  int iVar4;
  int in_R8D;
  undefined1 uVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  
  pbVar2 = (byte *)CONCAT44(in_register_0000000c,rounding);
  fVar7 = 0.0;
  if (in_R8D != 0) {
    fVar7 = 1.0;
  }
  fVar8 = (float)(b->field_0).field_0.r;
  iVar4 = (int)(((float)*pbVar2 - fVar8) * f + fVar8 + fVar7);
  if (0xfe < iVar4) {
    iVar4 = 0xff;
  }
  fVar8 = (float)(b->field_0).field_0.g;
  if (iVar4 < 1) {
    iVar4 = 0;
  }
  iVar6 = (int)(((float)pbVar2[1] - fVar8) * f + fVar8 + fVar7);
  if (0xfe < iVar6) {
    iVar6 = 0xff;
  }
  fVar8 = (float)(b->field_0).field_0.b;
  uVar5 = (char)iVar6;
  if (iVar6 < 1) {
    uVar5 = 0;
  }
  iVar1 = (int)(((float)pbVar2[2] - fVar8) * f + fVar8 + fVar7);
  iVar6 = 0xff;
  if (iVar1 < 0xff) {
    iVar6 = iVar1;
  }
  uVar3 = (char)iVar6;
  if (iVar6 < 1) {
    uVar3 = 0;
  }
  *(char *)&this->m_pParams = (char)iVar4;
  *(undefined1 *)((long)&this->m_pParams + 1) = uVar5;
  *(undefined1 *)((long)&this->m_pParams + 2) = uVar3;
  *(undefined1 *)((long)&this->m_pParams + 3) = 0xff;
  *(undefined4 *)((long)&this->m_pParams + 4) = 1;
  return (unique_color)this;
}

Assistant:

unique_color dxt1_endpoint_optimizer::lerp_color(const color_quad_u8& a, const color_quad_u8& b, float f, int rounding)
    {
        color_quad_u8 res;

        float r = rounding ? 1.0f : 0.0f;
        res[0] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[0], b[0], f)), 0, 255));
        res[1] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[1], b[1], f)), 0, 255));
        res[2] = static_cast<uint8>(math::clamp(math::float_to_int(r + math::lerp<float>(a[2], b[2], f)), 0, 255));
        res[3] = 255;

        return unique_color(res, 1);
    }